

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  size_t expected_size;
  Iterator end;
  Iterator iterator;
  int value;
  int x;
  Vector vector;
  int i;
  ulong local_68;
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  undefined4 local_40;
  undefined4 local_3c;
  ulong local_38;
  ulong local_30;
  int local_14 [4];
  int local_4;
  
  local_4 = 0;
  printf("TESTING SETUP ...\n");
  memset(&local_38,0,0x20);
  uVar3 = vector_is_initialized(&local_38);
  if ((uVar3 & 1) != 0) {
    __assert_fail("!vector_is_initialized(&vector)",
                  "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                  ,0xb,"int main(int, const char **)");
  }
  vector_setup(&local_38,0,4);
  uVar3 = vector_is_initialized(&local_38);
  if ((uVar3 & 1) == 0) {
    __assert_fail("vector_is_initialized(&vector)",
                  "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                  ,0xd,"int main(int, const char **)");
  }
  printf("TESTING INSERT ...\n");
  for (local_14[0] = 0; local_14[0] < 1000; local_14[0] = local_14[0] + 1) {
    iVar2 = vector_insert(&local_38,0,local_14);
    if (iVar2 != 0) {
      __assert_fail("vector_insert(&vector, 0, &i) == VECTOR_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                    ,0x12,"int main(int, const char **)");
    }
    piVar4 = (int *)vector_get(&local_38,0);
    if (*piVar4 != local_14[0]) {
      __assert_fail("VECTOR_GET_AS(int, &vector, 0) == i",
                    "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                    ,0x13,"int main(int, const char **)");
    }
    if (local_38 != (long)(local_14[0] + 1)) {
      __assert_fail("vector.size == i + 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                    ,0x14,"int main(int, const char **)");
    }
  }
  local_3c = 5;
  vector_push_back(&local_38,&local_3c);
  vector_insert(&local_38,local_38,&local_3c);
  printf("TESTING ASSIGNMENT ...\n");
  for (local_14[0] = 0; (ulong)(long)local_14[0] < local_38; local_14[0] = local_14[0] + 1) {
    local_40 = 0x29a;
    iVar2 = vector_assign(&local_38,(long)local_14[0],&local_40);
    if (iVar2 != 0) {
      __assert_fail("vector_assign(&vector, i, &value) == VECTOR_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                    ,0x1f,"int main(int, const char **)");
    }
  }
  printf("TESTING ITERATION ...\n");
  local_50 = vector_begin(&local_38);
  local_60 = vector_end(&local_38);
  while( true ) {
    bVar1 = iterator_equals(local_50,local_60);
    if (((bVar1 ^ 0xff) & 1) == 0) break;
    piVar4 = (int *)iterator_get(local_50);
    if (*piVar4 != 0x29a) {
      __assert_fail("ITERATOR_GET_AS(int, &iterator) == 666",
                    "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                    ,0x25,"int main(int, const char **)");
    }
    iterator_increment(local_50);
  }
  printf("TESTING REMOVAL ...\n");
  local_68 = local_38;
  while( true ) {
    uVar3 = vector_is_empty(&local_38);
    if (((uVar3 ^ 0xff) & 1) == 0) break;
    iVar2 = vector_erase(&local_38,0);
    if (iVar2 != 0) {
      __assert_fail("vector_erase(&vector, 0) == VECTOR_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                    ,0x2c,"int main(int, const char **)");
    }
    local_68 = local_68 - 1;
    if (local_38 != local_68) {
      __assert_fail("vector.size == --expected_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                    ,0x2d,"int main(int, const char **)");
    }
  }
  printf("TESTING RESIZE ...\n");
  iVar2 = vector_resize(&local_38,100);
  if (iVar2 != 0) {
    __assert_fail("vector_resize(&vector, 100) == VECTOR_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                  ,0x31,"int main(int, const char **)");
  }
  if (local_38 != 100) {
    __assert_fail("vector.size == 100",
                  "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                  ,0x32,"int main(int, const char **)");
  }
  if (local_30 < 0x65) {
    __assert_fail("vector.capacity > 100",
                  "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                  ,0x33,"int main(int, const char **)");
  }
  printf("TESTING RESERVE ...\n");
  iVar2 = vector_reserve(&local_38,200);
  if (iVar2 == 0) {
    if (local_38 != 100) {
      __assert_fail("vector.size == 100",
                    "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                    ,0x37,"int main(int, const char **)");
    }
    if (local_30 != 200) {
      __assert_fail("vector.capacity == 200",
                    "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                    ,0x38,"int main(int, const char **)");
    }
    printf("TESTING CLEAR ...\n");
    iVar2 = vector_clear(&local_38);
    if (iVar2 != 0) {
      __assert_fail("vector_clear(&vector) == VECTOR_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                    ,0x3b,"int main(int, const char **)");
    }
    if (local_38 == 0) {
      uVar3 = vector_is_empty(&local_38);
      if ((uVar3 & 1) == 0) {
        __assert_fail("vector_is_empty(&vector)",
                      "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                      ,0x3e,"int main(int, const char **)");
      }
      if (local_30 != 1) {
        __assert_fail("vector.capacity == VECTOR_MINIMUM_CAPACITY",
                      "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                      ,0x3f,"int main(int, const char **)");
      }
      vector_destroy(&local_38);
      printf("\x1b[92mALL TEST PASSED\x1b[0m\n");
      return local_4;
    }
    __assert_fail("vector.size == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                  ,0x3d,"int main(int, const char **)");
  }
  __assert_fail("vector_reserve(&vector, 200) == VECTOR_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/test/test.c"
                ,0x36,"int main(int, const char **)");
}

Assistant:

int main(int argc, const char* argv[]) {
	int i;

	printf("TESTING SETUP ...\n");
	Vector vector = VECTOR_INITIALIZER;
	assert(!vector_is_initialized(&vector));
	vector_setup(&vector, 0, sizeof(int));
	assert(vector_is_initialized(&vector));

	printf("TESTING INSERT ...\n");

	for (i = 0; i < 1000; ++i) {
		assert(vector_insert(&vector, 0, &i) == VECTOR_SUCCESS);
		assert(VECTOR_GET_AS(int, &vector, 0) == i);
		assert(vector.size == i + 1);
	}

	int x = 5;
	vector_push_back(&vector, &x);
	vector_insert(&vector, vector.size, &x);

	printf("TESTING ASSIGNMENT ...\n");

	for (i = 0; i < vector.size; ++i) {
		int value = 666;
		assert(vector_assign(&vector, i, &value) == VECTOR_SUCCESS);
	}

	printf("TESTING ITERATION ...\n");

	VECTOR_FOR_EACH(&vector, iterator) {
		assert(ITERATOR_GET_AS(int, &iterator) == 666);
	}

	printf("TESTING REMOVAL ...\n");

	size_t expected_size = vector.size;
	while (!vector_is_empty(&vector)) {
		assert(vector_erase(&vector, 0) == VECTOR_SUCCESS);
		assert(vector.size == --expected_size);
	}

	printf("TESTING RESIZE ...\n");
	assert(vector_resize(&vector, 100) == VECTOR_SUCCESS);
	assert(vector.size == 100);
	assert(vector.capacity > 100);

	printf("TESTING RESERVE ...\n");
	assert(vector_reserve(&vector, 200) == VECTOR_SUCCESS);
	assert(vector.size == 100);
	assert(vector.capacity == 200);

	printf("TESTING CLEAR ...\n");
	assert(vector_clear(&vector) == VECTOR_SUCCESS);

	assert(vector.size == 0);
	assert(vector_is_empty(&vector));
	assert(vector.capacity == VECTOR_MINIMUM_CAPACITY);

	vector_destroy(&vector);

	printf("\033[92mALL TEST PASSED\033[0m\n");
}